

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool cosine_check(double param_1,double b)

{
  double b_local;
  double param_0_local;
  
  if (0.0 >= b) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"COSINE_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  B <= 0.0\n");
  }
  return 0.0 < b;
}

Assistant:

bool cosine_check ( double /*a*/, double b )

//****************************************************************************80
//
//  Purpose:
//
//    COSINE_CHECK checks the parameters of the Cosine CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameter of the PDF.
//    0.0 < B.
//
//    Output, bool COSINE_CHECK, is true if the parameters are legal.
//
{
  if ( b <= 0.0 )
  {
    cerr << " \n";
    cerr << "COSINE_CHECK - Warning!\n";
    cerr << "  B <= 0.0\n";
    return false;
  }

  return true;
}